

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlCompiler.h
# Opt level: O2

void __thiscall rlib::sequencer::MmlCompiler::EventMeta::~EventMeta(EventMeta *this)

{
  (this->super_Event)._vptr_Event = (_func_int **)&PTR__EventMeta_0017ad88;
  std::__cxx11::string::~string((string *)&this->data);
  return;
}

Assistant:

virtual std::shared_ptr<Event> clone()const {
				return std::make_shared<EventMeta>(*this);
			}